

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  stringstream local_3a0 [8];
  stringstream val1_ss;
  long local_390;
  undefined8 auStack_388 [46];
  stringstream local_218 [8];
  stringstream val2_ss;
  long local_208;
  undefined8 auStack_200 [46];
  AssertionResult local_90;
  string local_80;
  string local_60;
  FloatingPointUnion local_40;
  FloatingPointUnion local_3c;
  FloatingPoint<float> lhs;
  FloatingPoint<float> rhs;
  char *expr1_local;
  char *expr2_local;
  
  if (val2 <= val1) {
    local_40.value_ = val1;
    local_3c.value_ = val2;
    _lhs = expr1;
    expr1_local = expr2;
    expr2_local._0_4_ = val1;
    expr2_local._4_4_ = val2;
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)&local_40,(FloatingPoint<float> *)&local_3c);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_3a0);
      *(undefined8 *)((long)auStack_388 + *(long *)(local_390 + -0x18)) = 8;
      std::ostream::operator<<(&local_390,expr2_local._0_4_);
      std::__cxx11::stringstream::stringstream(local_218);
      *(undefined8 *)((long)auStack_200 + *(long *)(local_208 + -0x18)) = 8;
      std::ostream::operator<<(&local_208,expr2_local._4_4_);
      local_90.success_ = false;
      local_90.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_90,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&lhs);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0xb10fe9);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0xb1090b);
      StringStreamToString(&local_80,(stringstream *)local_3a0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_80);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_60,(stringstream *)local_218);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_90.message_);
      std::__cxx11::stringstream::~stringstream(local_218);
      std::__cxx11::stringstream::~stringstream(local_3a0);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_00afc3d7;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_00afc3d7:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}